

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseMinMax(FScanner *sc,FName *identifier,PClassActor *cls)

{
  bool bVar1;
  FxExpression *pFVar2;
  FxMinMax *this;
  TArray<FxExpression_*,_FxExpression_*> list;
  FName local_4c;
  TArray<FxExpression_*,_FxExpression_*> local_48;
  FScriptPosition local_38;
  
  local_48.Array = (FxExpression **)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  while( true ) {
    pFVar2 = ParseExpressionM(sc,cls);
    TArray<FxExpression_*,_FxExpression_*>::Grow(&local_48,1);
    local_48.Array[local_48.Count] = pFVar2;
    local_48.Count = local_48.Count + 1;
    bVar1 = FScanner::CheckToken(sc,0x29);
    if (bVar1) break;
    FScanner::MustGetToken(sc,0x2c);
  }
  this = (FxMinMax *)FMemArena::Alloc(&FxAlloc,0x40);
  local_4c = (FName)identifier->Index;
  FScriptPosition::FScriptPosition(&local_38,sc);
  FxMinMax::FxMinMax(this,&local_48,&local_4c,&local_38);
  FString::~FString(&local_38.FileName);
  TArray<FxExpression_*,_FxExpression_*>::~TArray(&local_48);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseMinMax(FScanner &sc, FName identifier, PClassActor *cls)
{
	TArray<FxExpression*> list;
	for (;;)
	{
		FxExpression *expr = ParseExpressionM(sc, cls);
		list.Push(expr);
		if (sc.CheckToken(')'))
			break;
		sc.MustGetToken(',');
	}
	return new FxMinMax(list, identifier, sc);
}